

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

ComputePipelineStateCreateInfoX * __thiscall
Diligent::ComputePipelineStateCreateInfoX::Clear(ComputePipelineStateCreateInfoX *this)

{
  undefined1 local_178 [8];
  ComputePipelineStateCreateInfoX CleanDesc;
  ComputePipelineStateCreateInfoX *this_local;
  
  CleanDesc.
  super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  .InternalData._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)this;
  ComputePipelineStateCreateInfoX((ComputePipelineStateCreateInfoX *)local_178);
  std::swap<Diligent::ComputePipelineStateCreateInfoX>
            (this,(ComputePipelineStateCreateInfoX *)local_178);
  ~ComputePipelineStateCreateInfoX((ComputePipelineStateCreateInfoX *)local_178);
  return this;
}

Assistant:

ComputePipelineStateCreateInfoX& Clear()
    {
        ComputePipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }